

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_prov_cipher.c
# Opt level: O1

int cipher_encrypt_init(void *vgctx,uchar *key,size_t keylen,uchar *iv,size_t ivlen,
                       OSSL_PARAM *params)

{
  int iVar1;
  
  iVar1 = cipher_set_ctx_params(vgctx,params);
  if (iVar1 != 0) {
    iVar1 = EVP_CIPHER_get_key_length(*(undefined8 *)((long)vgctx + 0x18));
    if (keylen <= (ulong)(long)iVar1) {
      iVar1 = EVP_CIPHER_get_iv_length(*(undefined8 *)((long)vgctx + 0x18));
      if (ivlen <= (ulong)(long)iVar1) {
        iVar1 = EVP_CipherInit_ex(*(EVP_CIPHER_CTX **)((long)vgctx + 0x20),
                                  *(EVP_CIPHER **)((long)vgctx + 0x18),*(ENGINE **)(*vgctx + 0x18),
                                  key,iv,1);
        return iVar1;
      }
    }
  }
  return 0;
}

Assistant:

static int cipher_encrypt_init(void *vgctx,
                               const unsigned char *key, size_t keylen,
                               const unsigned char *iv, size_t ivlen,
                               const OSSL_PARAM params[])
{
    GOST_CTX *gctx = vgctx;

    if (!cipher_set_ctx_params(vgctx, params)
        || keylen > EVP_CIPHER_key_length(gctx->cipher)
        || ivlen > EVP_CIPHER_iv_length(gctx->cipher))
        return 0;

    return EVP_CipherInit_ex(gctx->cctx, gctx->cipher, gctx->provctx->e,
                             key, iv, 1);
}